

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O0

void debugReportHighsSolution
               (string *message,HighsLogOptions *log_options,HighsInfo *highs_info,
               HighsModelStatus model_status)

{
  undefined8 uVar1;
  long in_RDX;
  HighsLogOptions *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  HighsModelStatus in_stack_0000006c;
  string *psVar2;
  string local_40 [40];
  long local_18;
  HighsLogOptions *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar1 = std::__cxx11::string::c_str();
  highsLogDev(in_RSI,kInfo,"\nHiGHS solution: %s\n",uVar1);
  if ((-1 < *(int *)(local_18 + 0x58)) || (-1 < *(int *)(local_18 + 0x70))) {
    highsLogDev(local_10,kInfo,"Infeas:                ");
  }
  if (-1 < *(int *)(local_18 + 0x58)) {
    highsLogDev(*(HighsLogOptions **)(local_18 + 0x60),*(HighsLogType *)(local_18 + 0x68),
                (char *)local_10,1,"Pr %d(Max %.4g, Sum %.4g); ",(ulong)*(uint *)(local_18 + 0x58));
  }
  if (-1 < *(int *)(local_18 + 0x70)) {
    highsLogDev(*(HighsLogOptions **)(local_18 + 0x78),*(HighsLogType *)(local_18 + 0x80),
                (char *)local_10,1,"Du %d(Max %.4g, Sum %.4g); ",(ulong)*(uint *)(local_18 + 0x70));
  }
  psVar2 = local_40;
  utilModelStatusToString_abi_cxx11_(in_stack_0000006c);
  uVar1 = std::__cxx11::string::c_str();
  highsLogDev(local_10,kInfo,"Status: %s\n",uVar1,in_R8,in_R9,psVar2);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void debugReportHighsSolution(const string message,
                              const HighsLogOptions& log_options,
                              const HighsInfo& highs_info,
                              const HighsModelStatus model_status) {
  highsLogDev(log_options, HighsLogType::kInfo, "\nHiGHS solution: %s\n",
              message.c_str());
  if (highs_info.num_primal_infeasibilities >= 0 ||
      highs_info.num_dual_infeasibilities >= 0) {
    highsLogDev(log_options, HighsLogType::kInfo, "Infeas:                ");
  }
  if (highs_info.num_primal_infeasibilities >= 0) {
    highsLogDev(log_options, HighsLogType::kInfo,
                "Pr %" HIGHSINT_FORMAT "(Max %.4g, Sum %.4g); ",
                highs_info.num_primal_infeasibilities,
                highs_info.max_primal_infeasibility,
                highs_info.sum_primal_infeasibilities);
  }
  if (highs_info.num_dual_infeasibilities >= 0) {
    highsLogDev(log_options, HighsLogType::kInfo,
                "Du %" HIGHSINT_FORMAT "(Max %.4g, Sum %.4g); ",
                highs_info.num_dual_infeasibilities,
                highs_info.max_dual_infeasibility,
                highs_info.sum_dual_infeasibilities);
  }
  highsLogDev(log_options, HighsLogType::kInfo, "Status: %s\n",
              utilModelStatusToString(model_status).c_str());
}